

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     Combine<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,false>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t i;
  idx_t iVar3;
  
  pdVar1 = source->data;
  pdVar2 = target->data;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    FirstFunctionStringBase<false,false>::
    Combine<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,false>>
              (*(FirstState<duckdb::string_t> **)(pdVar1 + iVar3 * 8),
               *(FirstState<duckdb::string_t> **)(pdVar2 + iVar3 * 8),aggr_input_data);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}